

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

Layer * __thiscall ncnn::Net::create_custom_layer(Net *this,char *type)

{
  int index_00;
  Net *in_RSI;
  char *in_RDI;
  int index;
  Net *in_stack_fffffffffffffff8;
  Layer *pLVar1;
  
  index_00 = custom_layer_to_index(in_stack_fffffffffffffff8,in_RDI);
  if (index_00 == -1) {
    pLVar1 = (Layer *)0x0;
  }
  else {
    pLVar1 = create_custom_layer(in_RSI,index_00);
  }
  return pLVar1;
}

Assistant:

Layer* Net::create_custom_layer(const char* type)
{
    int index = custom_layer_to_index(type);
    if (index == -1)
        return 0;

    return create_custom_layer(index);
}